

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

typed_value<std::vector<bool,_std::allocator<bool>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<bool>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<bool>_> *opt)

{
  initializer_list<bool> __l;
  bool bVar1;
  value_semantic_codecvt_helper<char> vVar2;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *ptVar3;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *value;
  undefined7 in_stack_ffffffffffffffa8;
  iterator pbVar4;
  size_type in_stack_ffffffffffffffc0;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  options_boost_po *in_stack_ffffffffffffffe0;
  
  ptVar3 = boost::program_options::value<std::vector<bool,std::allocator<bool>>>();
  std::__shared_ptr_access<VW::config::typed_option<bool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<VW::config::typed_option<bool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x122675);
  bVar1 = typed_option<bool>::default_value_supplied((typed_option<bool> *)0x12267d);
  if (bVar1) {
    std::
    __shared_ptr_access<VW::config::typed_option<bool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<VW::config::typed_option<bool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12269a);
    vVar2 = (value_semantic_codecvt_helper<char>)
            typed_option<bool>::default_value((typed_option<bool> *)ptVar3);
    ptVar3 = (typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *)&stack0xffffffffffffffaf
    ;
    pbVar4 = (iterator)0x1;
    std::allocator<bool>::allocator((allocator<bool> *)0x1226c8);
    __l._M_len = in_stack_ffffffffffffffc0;
    __l._M_array = pbVar4;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)ptVar3,__l,
               (allocator_type *)CONCAT17(vVar2,in_stack_ffffffffffffffa8));
    boost::program_options::typed_value<std::vector<bool,_std::allocator<bool>_>,_char>::
    default_value(ptVar3,(vector<bool,_std::allocator<bool>_> *)
                         CONCAT17(vVar2,in_stack_ffffffffffffffa8));
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x1226fe);
    std::allocator<bool>::~allocator((allocator<bool> *)0x122708);
  }
  ptVar3 = add_notifier<bool>(in_stack_ffffffffffffffe0,
                              (shared_ptr<VW::config::typed_option<bool>_> *)
                              in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  ptVar3 = boost::program_options::typed_value<std::vector<bool,_std::allocator<bool>_>,_char>::
           composing(ptVar3);
  return ptVar3;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(std::shared_ptr<typed_option<T>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value({opt->default_value()});
  }

  return add_notifier(opt, value)->composing();
}